

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PP_FDTD_1D.cpp
# Opt level: O1

void __thiscall
PP_FDTD_1D::PP_FDTD_1D
          (PP_FDTD_1D *this,double _dt,double _DT,double _dz,double _DZ,double _R,double _L,
          double _C,double _G)

{
  PP_smartAlloc *this_00;
  ulong uVar1;
  ulong uVar2;
  double **ppdVar3;
  
  this->_vptr_PP_FDTD_1D = (_func_int **)&PTR__PP_FDTD_1D_00116cc8;
  this_00 = &this->myAllocator;
  PP_smartAlloc::PP_smartAlloc(this_00);
  this->dt = _dt;
  this->DT = _DT;
  this->dz = _dz;
  this->DZ = _DZ;
  this->R = _R;
  this->L = _L;
  this->C = _C;
  this->G = _G;
  uVar1 = (ulong)(_DT / _dt);
  uVar1 = (long)(_DT / _dt - 9.223372036854776e+18) & (long)uVar1 >> 0x3f | uVar1;
  this->Nt = uVar1;
  uVar2 = (ulong)(_DZ / _dz);
  uVar2 = (long)(_DZ / _dz - 9.223372036854776e+18) & (long)uVar2 >> 0x3f | uVar2;
  this->Nz = uVar2;
  ppdVar3 = PP_smartAlloc::allocateDouble(this_00,uVar1,uVar2);
  this->V = ppdVar3;
  ppdVar3 = PP_smartAlloc::allocateDouble(this_00,this->Nt,this->Nz);
  this->I = ppdVar3;
  return;
}

Assistant:

PP_FDTD_1D::PP_FDTD_1D(double _dt, double _DT, double _dz, double _DZ, double _R, double _L, double _C, double _G)
{
    dt = _dt;
    DT = _DT;
    dz = _dz;
    DZ = _DZ;
    R = _R;
    L = _L;
    C = _C;
    G = _G;
    Nt = (unsigned long) (DT/dt);
    Nz = (unsigned long) (DZ/dz);
    V = myAllocator.allocateDouble(Nt,Nz);
    I = myAllocator.allocateDouble(Nt,Nz);
}